

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
          (Promise<void> *this,
          Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *attachments)

{
  PromiseBase PVar1;
  undefined8 *in_RDX;
  PromiseBase local_48;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_40;
  ArrayBuilder<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> local_38;
  
  local_38.ptr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)*in_RDX;
  local_38.pos = (RemoveConst<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *)in_RDX[1];
  local_38.endPtr = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)in_RDX[2];
  local_38.disposer = (ArrayDisposer *)in_RDX[3];
  *in_RDX = 0;
  in_RDX[1] = 0;
  in_RDX[2] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>,kj::_::PromiseDisposer,kj::Vector<kj::ArrayPtr<kj::ArrayPtr<capnp::word_const>const>>>
            ((PromiseDisposer *)&local_48,(OwnPromiseNode *)attachments,
             (Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_> *)&local_38);
  PVar1.node.ptr = local_48.node.ptr;
  local_48.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_40.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
  Own<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>_>,_kj::_::PromiseDisposer>
  ::dispose((Own<kj::_::AttachmentPromiseNode<kj::Vector<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>_>,_kj::_::PromiseDisposer>
             *)&local_48);
  ArrayBuilder<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_>::dispose(&local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}